

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

enable_if_t<IteratorRange<__normal_iterator<const_array<double,_3UL>_*,_vector<array<double,_3UL>_>_>,_array<double,_3UL>_>::is_container>
 gnuplotio::
 deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,std::array<double,3ul>>,gnuplotio::ModeText>
           (ostream *stream,
           IteratorRange<__gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,_std::array<double,_3UL>_>
           *arg)

{
  bool bVar1;
  bool bVar2;
  plotting_empty_container *this;
  undefined1 auStack_40 [7];
  bool first;
  subiter_type subrange;
  IteratorRange<__gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,_std::array<double,_3UL>_>
  *arg_local;
  ostream *stream_local;
  
  bVar1 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,_std::array<double,_3UL>_>
          ::is_end(arg);
  if (!bVar1) {
    _auStack_40 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>,_std::array<double,_3UL>_>
                  ::deref_subiter(arg);
    if ((debug_array_print & 1) != 0) {
      std::operator<<(stream,"{");
    }
    bVar1 = true;
    while( true ) {
      bVar2 = IteratorRange<const_double_*,_double>::is_end
                        ((IteratorRange<const_double_*,_double> *)auStack_40);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      if (!bVar1) {
        std::operator<<(stream," ");
      }
      bVar1 = false;
      deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
                (stream,auStack_40);
      IteratorRange<const_double_*,_double>::inc
                ((IteratorRange<const_double_*,_double> *)auStack_40);
    }
    if ((debug_array_print & 1) != 0) {
      std::operator<<(stream,"}");
    }
    return;
  }
  this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
  plotting_empty_container::plotting_empty_container(this);
  __cxa_throw(this,&plotting_empty_container::typeinfo,
              plotting_empty_container::~plotting_empty_container);
}

Assistant:

typename std::enable_if_t<T::is_container>
deref_and_print(std::ostream &stream, const T &arg, PrintMode) {
    if(arg.is_end()) throw plotting_empty_container();
    typename T::subiter_type subrange = arg.deref_subiter();
    if(PrintMode::is_binfmt && subrange.is_end()) throw plotting_empty_container();
    if(debug_array_print && PrintMode::is_text) stream << "{";
    bool first = true;
    while(!subrange.is_end()) {
        if(!first && PrintMode::is_text) stream << " ";
        first = false;
        deref_and_print(stream, subrange, PrintMode());
        subrange.inc();
    }
    if(debug_array_print && PrintMode::is_text) stream << "}";
}